

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O1

string * __thiscall
libtorrent::make_magnet_uri_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,torrent_info *info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  add_torrent_params *extraout_RDX;
  add_torrent_params *extraout_RDX_00;
  add_torrent_params *extraout_RDX_01;
  add_torrent_params *atp_00;
  announce_entry *tr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  web_seed_entry *s;
  add_torrent_params atp;
  undefined1 auStack_378 [96];
  string local_318 [196];
  uint local_254 [2];
  uint auStack_24c [4];
  uint auStack_23c [2];
  uint local_234 [2];
  uint auStack_22c [2];
  uint local_224;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_1b0 [392];
  
  add_torrent_params::add_torrent_params((add_torrent_params *)auStack_378);
  local_224 = *(uint *)(this + 0x260);
  local_254 = *(uint (*) [2])(this + 0x230);
  auStack_24c._0_8_ = *(undefined8 *)(this + 0x238);
  auStack_24c._8_8_ = *(undefined8 *)(this + 0x240);
  auStack_23c = *(uint (*) [2])(this + 0x248);
  local_234 = *(uint (*) [2])(this + 0x250);
  auStack_22c = *(uint (*) [2])(this + 600);
  ::std::__cxx11::string::_M_assign(local_318);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(auStack_378 + 0x18),
            (*(long *)(this + 200) - *(long *)(this + 0xc0) >> 5) * -0x5555555555555555);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 200);
  atp_00 = extraout_RDX;
  for (pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xc0)
      ; pbVar2 != pbVar1; pbVar2 = pbVar2 + 3) {
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (auStack_378 + 0x18),pbVar2);
    atp_00 = extraout_RDX_00;
  }
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xd8);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xe0);
  if (pbVar2 != pbVar1) {
    do {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>(local_1b0,pbVar2);
      pbVar2 = pbVar2 + 3;
      atp_00 = extraout_RDX_01;
    } while (pbVar2 != pbVar1);
  }
  make_magnet_uri_abi_cxx11_(__return_storage_ptr__,(libtorrent *)auStack_378,atp_00);
  add_torrent_params::~add_torrent_params((add_torrent_params *)auStack_378);
  return __return_storage_ptr__;
}

Assistant:

std::string make_magnet_uri(torrent_info const& info)
	{
		add_torrent_params atp;
		atp.info_hashes = info.info_hashes();
		atp.name = info.name();
		atp.trackers.reserve(info.internal_trackers().size());
		for (auto const& tr : info.internal_trackers())
			atp.trackers.emplace_back(tr.url);
		for (auto const& s : info.internal_web_seeds())
			atp.url_seeds.emplace_back(s.url);

		return make_magnet_uri(atp);
	}